

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFileListGeneratorGlob::~cmFileListGeneratorGlob(cmFileListGeneratorGlob *this)

{
  ~cmFileListGeneratorGlob(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmFileListGeneratorGlob(std::string const& str)
    : cmFileListGeneratorBase()
    , Pattern(str)
  {
  }